

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutex-posix.c
# Opt level: O0

pboolean p_mutex_lock(PMutex *mutex)

{
  int iVar1;
  PMutex *mutex_local;
  
  if (mutex == (PMutex *)0x0) {
    mutex_local._4_4_ = 0;
  }
  else {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)mutex);
    if (iVar1 == 0) {
      mutex_local._4_4_ = 1;
    }
    else {
      printf("** Error: %s **\n","PMutex::p_mutex_lock: pthread_mutex_lock() failed");
      mutex_local._4_4_ = 0;
    }
  }
  return mutex_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_mutex_lock (PMutex *mutex)
{
	if (P_UNLIKELY (mutex == NULL))
		return FALSE;

	if (P_LIKELY (pthread_mutex_lock (&mutex->hdl) == 0))
		return TRUE;
	else {
		P_ERROR ("PMutex::p_mutex_lock: pthread_mutex_lock() failed");
		return FALSE;
	}
}